

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O2

void __thiscall duckdb::ReservoirSamplePercentage::Finalize(ReservoirSamplePercentage *this)

{
  idx_t iVar1;
  Allocator *args;
  _Head_base<0UL,_duckdb::ReservoirSample_*,_false> _Var2;
  pointer this_00;
  pointer pRVar3;
  pointer pDVar4;
  type pDVar5;
  undefined1 auVar6 [16];
  double dVar7;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> chunk;
  idx_t new_sample_size;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> local_48;
  _Head_base<0UL,_duckdb::ReservoirSample_*,_false> local_40;
  ulong local_38;
  
  iVar1 = this->current_count;
  auVar6._8_4_ = (int)(iVar1 >> 0x20);
  auVar6._0_8_ = iVar1;
  auVar6._12_4_ = 0x45300000;
  dVar7 = (auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)iVar1) - 4503599627370496.0);
  if ((iVar1 == 0) ||
     (dVar7 <= this->sample_percentage * 100000.0 &&
      (this->finished_samples).
      super_vector<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->finished_samples).
      super_vector<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    ::std::
    vector<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>,std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>,std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>>>
                *)&this->finished_samples,&this->current_sample);
  }
  else {
    dVar7 = round(this->sample_percentage * dVar7);
    local_38 = (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
    args = this->allocator;
    this_00 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
              ::operator->(&(this->super_BlockingSample).base_reservoir_sample);
    local_48._M_t.super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>.
    _M_t.super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
    super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl._0_4_ =
         RandomEngine::NextRandomInteger((RandomEngine *)this_00);
    make_uniq<duckdb::ReservoirSample,duckdb::Allocator&,unsigned_long&,unsigned_int>
              ((duckdb *)&local_40,args,&local_38,(uint *)&local_48);
    while( true ) {
      pRVar3 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
               ::operator->(&this->current_sample);
      (*(pRVar3->super_BlockingSample)._vptr_BlockingSample[6])(&local_48,pRVar3);
      if (CONCAT44(local_48._M_t.
                   super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>
                   .super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl._4_4_,
                   (uint32_t)
                   local_48._M_t.
                   super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>
                   .super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl) == 0) break;
      pDVar4 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                           *)&local_48);
      if (pDVar4->count == 0) break;
      pRVar3 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
               ::operator->((unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                             *)&local_40);
      pDVar5 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
               operator*((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                          *)&local_48);
      (*(pRVar3->super_BlockingSample)._vptr_BlockingSample[2])(pRVar3,pDVar5);
      ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
                (&local_48);
    }
    ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
              (&local_48);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>,std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>,std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>>>
                *)&this->finished_samples,
               (unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                *)&local_40);
    if (local_40._M_head_impl != (ReservoirSample *)0x0) {
      (*((local_40._M_head_impl)->super_BlockingSample)._vptr_BlockingSample[1])();
    }
  }
  _Var2._M_head_impl =
       (this->current_sample).
       super_unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>
       .super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl;
  (this->current_sample).
  super_unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>._M_t.
  super___uniq_ptr_impl<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>.
  super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl = (ReservoirSample *)0x0;
  if (_Var2._M_head_impl != (ReservoirSample *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BlockingSample + 8))();
  }
  this->is_finalized = true;
  return;
}

Assistant:

void ReservoirSamplePercentage::Finalize() {
	// need to finalize the current sample, if any
	// we are finializing, so we are starting to return chunks. Our last chunk has
	// sample_percentage * RESERVOIR_THRESHOLD entries that hold samples.
	// if our current count is less than the sample_percentage * RESERVOIR_THRESHOLD
	// then we have sampled too much for the current_sample and we need to redo the sample
	// otherwise we can just push the current sample back
	// Imagine sampling 70% of 100 rows (so 70 rows). We allocate sample_percentage * RESERVOIR_THRESHOLD
	// -----------------------------------------
	auto sampled_more_than_required =
	    static_cast<double>(current_count) > sample_percentage * RESERVOIR_THRESHOLD || finished_samples.empty();
	if (current_count > 0 && sampled_more_than_required) {
		// create a new sample
		auto new_sample_size = static_cast<idx_t>(round(sample_percentage * static_cast<double>(current_count)));
		auto new_sample = make_uniq<ReservoirSample>(allocator, new_sample_size, base_reservoir_sample->random());
		while (true) {
			auto chunk = current_sample->GetChunk();
			if (!chunk || chunk->size() == 0) {
				break;
			}
			new_sample->AddToReservoir(*chunk);
		}
		finished_samples.push_back(std::move(new_sample));
	} else {
		finished_samples.push_back(std::move(current_sample));
	}
	// when finalizing, current_sample is null. All samples are now in finished samples.
	current_sample = nullptr;
	is_finalized = true;
}